

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall
GameEngine::populationMove
          (GameEngine *this,shared_ptr<Population> *population,int32_t x_pos,int32_t y_pos)

{
  int32_t iVar1;
  element_type *peVar2;
  element_type *peVar3;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar4;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  shared_ptr<Population> local_50 [2];
  shared_ptr<Population> local_30;
  int32_t local_20;
  int32_t local_1c;
  int32_t y_pos_local;
  int32_t x_pos_local;
  shared_ptr<Population> *population_local;
  GameEngine *this_local;
  
  local_20 = y_pos;
  local_1c = x_pos;
  _y_pos_local = population;
  population_local = (shared_ptr<Population> *)this;
  peVar2 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  peVar3 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  iVar1 = Population::GetYPos(peVar3);
  pvVar4 = Map::operator[](peVar2,(long)iVar1);
  peVar3 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  iVar1 = Population::GetXPos(peVar3);
  p_Var5 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
           operator[](pvVar4,(long)iVar1);
  peVar6 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var5);
  std::shared_ptr<Population>::shared_ptr(&local_30,(nullptr_t)0x0);
  CellType::setCurrentPopulation(peVar6,&local_30);
  std::shared_ptr<Population>::~shared_ptr(&local_30);
  peVar2 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  pvVar4 = Map::operator[](peVar2,(long)local_20);
  p_Var5 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
           operator[](pvVar4,(long)local_1c);
  peVar6 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var5);
  std::shared_ptr<Population>::shared_ptr(local_50,population);
  CellType::setCurrentPopulation(peVar6,local_50);
  std::shared_ptr<Population>::~shared_ptr(local_50);
  peVar3 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  Population::move(peVar3,local_1c,local_20);
  return;
}

Assistant:

void GameEngine::populationMove(std::shared_ptr<Population> population, int32_t x_pos, int32_t y_pos) {
  (*map)[population->GetYPos()][population->GetXPos()]->setCurrentPopulation(nullptr);
  (*map)[y_pos][x_pos]->setCurrentPopulation(population);

  population->move(x_pos, y_pos);
}